

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servnotf.cpp
# Opt level: O0

void __thiscall icu_63::ICUNotifier::notifyChanged(ICUNotifier *this)

{
  int32_t iVar1;
  void *pvVar2;
  EventListener *el;
  int32_t local_1c;
  int e;
  int i;
  Mutex lmx;
  ICUNotifier *this_local;
  
  if (this->listeners != (UVector *)0x0) {
    lmx.fMutex = (UMutex *)this;
    Mutex::Mutex((Mutex *)&e,(UMutex *)notifyLock);
    if (this->listeners != (UVector *)0x0) {
      local_1c = 0;
      iVar1 = UVector::size(this->listeners);
      for (; local_1c < iVar1; local_1c = local_1c + 1) {
        pvVar2 = UVector::elementAt(this->listeners,local_1c);
        (*this->_vptr_ICUNotifier[6])(this,pvVar2);
      }
    }
    Mutex::~Mutex((Mutex *)&e);
  }
  return;
}

Assistant:

void 
ICUNotifier::notifyChanged(void) 
{
    if (listeners != NULL) {
        Mutex lmx(&notifyLock);
        if (listeners != NULL) {
            for (int i = 0, e = listeners->size(); i < e; ++i) {
                EventListener* el = (EventListener*)listeners->elementAt(i);
                notifyListener(*el);
            }
        }
    }
}